

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O0

void w128_from_bitstream(bitstream_t *bs,word128 *v,size_t width,size_t size)

{
  uint64_t uVar1;
  ulong in_RCX;
  long in_RDX;
  uint64_t *in_RSI;
  bitstream_t *in_RDI;
  size_t bits;
  uint64_t *d;
  uint64_t buf [4];
  ulong local_68;
  uint64_t *local_60;
  uint64_t local_58 [5];
  ulong local_30;
  long local_28;
  uint64_t *local_20;
  bitstream_t *local_18;
  
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  memset(local_58,0,0x20);
  local_60 = local_58 + local_28 + -1;
  for (local_68 = local_30; 0x3f < local_68; local_68 = local_68 - 0x40) {
    uVar1 = bitstream_get_bits(local_18,0x40);
    *local_60 = uVar1;
    local_60 = local_60 + -1;
  }
  if (local_68 != 0) {
    uVar1 = bitstream_get_bits(local_18,(uint)local_68);
    *local_60 = uVar1 << (0x40U - (char)local_68 & 0x3f);
  }
  *local_20 = local_58[0];
  local_20[1] = local_58[1];
  local_20[2] = local_58[2];
  local_20[3] = local_58[3];
  return;
}

Assistant:

ATTR_TARGET_S128
static inline void w128_from_bitstream(bitstream_t* bs, word128 v[2], const size_t width,
                                       const size_t size) {
  ATTR_ALIGNED(16) uint64_t buf[4] = {0};
  uint64_t* d                      = &buf[width - 1];
  size_t bits                      = size;
  for (; bits >= sizeof(uint64_t) * 8; bits -= sizeof(uint64_t) * 8, --d) {
    *d = bitstream_get_bits(bs, sizeof(uint64_t) * 8);
  }
  if (bits) {
    *d = bitstream_get_bits(bs, bits) << (sizeof(uint64_t) * 8 - bits);
  }

  v[0] = mm128_load(&buf[0]);
  v[1] = mm128_load(&buf[2]);
}